

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

uint32_t helper_unpku(CPUS390XState_conflict *env,uint64_t dest,uint32_t destlen,uint64_t src)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  target_ulong ptr;
  ulong uVar4;
  target_ulong ptr_00;
  uintptr_t unaff_retaddr;
  
  uVar1 = cpu_ldub_data_ra_s390x(env,src + 0xf,unaff_retaddr);
  uVar4 = (ulong)uVar1;
  uVar1 = *(uint32_t *)(&DAT_00dc8728 + (ulong)(uVar1 & 0xf) * 4);
  if (destlen != 0) {
    ptr_00 = src + 0xe;
    ptr = (destlen - 2) + dest;
    uVar3 = 0;
    do {
      if (uVar3 == 0x3e) {
        uVar4 = 0;
      }
      else if ((uVar3 & 2) == 0) {
        uVar4 = uVar4 >> 4 & 0xf;
      }
      else {
        uVar2 = cpu_ldub_data_ra_s390x(env,ptr_00,unaff_retaddr);
        uVar4 = (ulong)uVar2;
        ptr_00 = ptr_00 - 1;
      }
      cpu_stw_data_ra_s390x(env,ptr,(uint)((byte)uVar4 & 0xf | 0x30),unaff_retaddr);
      ptr = ptr - 2;
      uVar3 = uVar3 + 2;
    } while (uVar3 < destlen);
  }
  return uVar1;
}

Assistant:

uint32_t HELPER(unpku)(CPUS390XState *env, uint64_t dest, uint32_t destlen,
                       uint64_t src)
{
    return do_unpkau(env, dest, destlen, 2, src, GETPC());
}